

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O2

int __thiscall cab_manager::remove(cab_manager *this,char *__filename)

{
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  long lVar5;
  cab_manager *pcVar6;
  long lVar7;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  _Var8;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it;
  node_type pos;
  node_type local_51;
  cab_manager *local_50;
  key_type *local_48;
  key_type local_3c;
  pointer local_38;
  
  local_3c = (key_type)__filename;
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_3c);
  local_51 = cab::position((pmVar2->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this_00 = &this->_cabs_at_node;
  local_50 = this;
  pmVar3 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_51);
  __it._M_current =
       (pmVar3->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pmVar3 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_51);
  local_38 = (pmVar3->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)local_38 - (long)__it._M_current;
  local_48 = &local_3c;
  for (lVar7 = lVar5 >> 6; _Var8._M_current = __it._M_current, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                      ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,__it);
    pcVar6 = local_50;
    if (bVar1) goto LAB_001573e6;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                      ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,
                       __it._M_current + 1);
    pcVar6 = local_50;
    _Var8._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_001573e6;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                      ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,
                       __it._M_current + 2);
    pcVar6 = local_50;
    _Var8._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_001573e6;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                      ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,
                       __it._M_current + 3);
    pcVar6 = local_50;
    _Var8._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_001573e6;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  pcVar6 = local_50;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var8._M_current = local_38;
      if ((lVar5 != 3) ||
         (bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                            ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,__it),
         pcVar6 = local_50, _Var8._M_current = __it._M_current, bVar1)) goto LAB_001573e6;
      _Var8._M_current = __it._M_current + 1;
    }
    pcVar6 = local_50;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                      ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,_Var8);
    if (bVar1) goto LAB_001573e6;
    __it._M_current = _Var8._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                    ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_48,__it);
  _Var8._M_current = local_38;
  if (bVar1) {
    _Var8._M_current = __it._M_current;
  }
LAB_001573e6:
  pmVar3 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_51);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::erase
            (pmVar3,(const_iterator)_Var8._M_current);
  sVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pcVar6,&local_3c);
  return (int)sVar4;
}

Assistant:

void cab_manager::remove(id_type id)
{
    node_type pos = _cabs[id]->position();
    auto it = std::find_if(_cabs_at_node[pos].begin(), _cabs_at_node[pos].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[pos].erase(it);
    _cabs.erase(id);
}